

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opt_algebraic.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_88f01::ir_algebraic_visitor::reassociate_operands
          (ir_algebraic_visitor *this,ir_expression *ir1,int op1,ir_expression *ir2,int op2)

{
  ir_rvalue *piVar1;
  glsl_type *pgVar2;
  
  piVar1 = ir2->operands[(uint)op2];
  ir2->operands[(uint)op2] = ir1->operands[(uint)op1];
  ir1->operands[(uint)op1] = piVar1;
  pgVar2 = ir2->operands[0]->type;
  if (((pgVar2->vector_elements < 2) || (pgVar2->matrix_columns != '\x01')) ||
     (0xb < (*(uint *)&pgVar2->field_0x4 & 0xfc))) {
    pgVar2 = ir2->operands[1]->type;
  }
  (ir2->super_ir_rvalue).type = pgVar2;
  this->progress = true;
  return;
}

Assistant:

void
ir_algebraic_visitor::reassociate_operands(ir_expression *ir1,
					   int op1,
					   ir_expression *ir2,
					   int op2)
{
   ir_rvalue *temp = ir2->operands[op2];
   ir2->operands[op2] = ir1->operands[op1];
   ir1->operands[op1] = temp;

   /* Update the type of ir2.  The type of ir1 won't have changed --
    * base types matched, and at least one of the operands of the 2
    * binops is still a vector if any of them were.
    */
   update_type(ir2);

   this->progress = true;
}